

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_3_2::Xdr::write<Imf_3_2::CharPtrIO,char*>(char **out,uint v)

{
  uchar b [4];
  
  CharPtrIO::writeChars(out,(char *)b,4);
  return;
}

Assistant:

void
write (T& out, unsigned int v)
{
    unsigned char b[4];

    b[0] = (unsigned char) (v);
    b[1] = (unsigned char) (v >> 8);
    b[2] = (unsigned char) (v >> 16);
    b[3] = (unsigned char) (v >> 24);

    writeUnsignedChars<S> (out, b, 4);
}